

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  ulong local_88;
  size_t n_3;
  size_t n_2;
  size_t n_1;
  size_t n;
  int R [5];
  uint auStack_48 [2];
  int T [10];
  char **argv_local;
  int argc_local;
  
  for (n_1 = 0; n_1 < 10; n_1 = n_1 + 1) {
    auStack_48[n_1] = 0;
  }
  for (n_2 = 0; n_2 < 5; n_2 = n_2 + 1) {
    R[n_2 - 2] = 10;
  }
  for (n_3 = 0; n_3 < 10; n_3 = n_3 + 1) {
    printf("%d ",(ulong)auStack_48[n_3]);
  }
  printf("\n");
  for (local_88 = 0; local_88 < 5; local_88 = local_88 + 1) {
    printf("%d ",(ulong)(uint)R[local_88 - 2]);
  }
  printf("\n");
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  int T[10];
  int R[5];

  for (size_t n = 0; n < 10; n++) {
    T[n] = 0;
  }
  for (size_t n = 0; n < 5; n++) {
    R[n] = 10;
  }

  for (size_t n = 0; n < 10; n++) {
    printf("%d ", T[n]);
  }
  printf("\n");
  for (size_t n = 0; n < 5; n++) {
    printf("%d ", R[n]);
  }
  printf("\n");
}